

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O3

CSVField * __thiscall
csv::CSVRow::operator[](CSVField *__return_storage_ptr__,CSVRow *this,string *col_name)

{
  uint uVar1;
  runtime_error *this_00;
  string_view sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar2._M_str = (col_name->_M_dataplus)._M_p;
  sVar2._M_len = col_name->_M_string_length;
  uVar1 = internals::ColNames::index_of
                    ((((this->data).
                       super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->col_names).
                     super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,sVar2);
  if (-1 < (int)uVar1) {
    sVar2 = get_field(this,(ulong)uVar1);
    __return_storage_ptr__->value = (longdouble)0;
    __return_storage_ptr__->sv = sVar2;
    __return_storage_ptr__->_type = UNKNOWN;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Can\'t find a column named ",col_name);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CSV_INLINE CSVField CSVRow::operator[](const std::string& col_name) const {
        auto & col_names = this->data->col_names;
        auto col_pos = col_names->index_of(col_name);
        if (col_pos > -1) {
            return this->operator[](col_pos);
        }

        throw std::runtime_error("Can't find a column named " + col_name);
    }